

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

JsonArrayWriter * __thiscall Catch::JsonReporter::startArray(JsonReporter *this,StringRef key)

{
  reference pvVar1;
  reference pvVar2;
  size_t in_RDX;
  void *in_RSI;
  JsonArrayWriter *in_RDI;
  JsonValueWriter *in_stack_fffffffffffffdf8;
  JsonObjectWriter local_1c8 [18];
  void *local_10;
  size_t sStack_8;
  
  local_10 = in_RSI;
  sStack_8 = in_RDX;
  pvVar1 = std::
           stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
           ::top((stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
                  *)0x1a35d6);
  JsonObjectWriter::write(local_1c8,(int)pvVar1,local_10,sStack_8);
  JsonValueWriter::writeArray(in_stack_fffffffffffffdf8);
  std::
  stack<Catch::JsonArrayWriter,_std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>_>
  ::emplace<Catch::JsonArrayWriter>
            ((stack<Catch::JsonArrayWriter,_std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>_>
              *)in_RDI,(JsonArrayWriter *)in_stack_fffffffffffffdf8);
  JsonArrayWriter::~JsonArrayWriter(in_RDI);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a363e);
  std::
  stack<Catch::JsonReporter::Writer,_std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>_>
  ::emplace<Catch::JsonReporter::Writer>
            ((stack<Catch::JsonReporter::Writer,_std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>_>
              *)in_RDI,(Writer *)in_stack_fffffffffffffdf8);
  pvVar2 = std::
           stack<Catch::JsonArrayWriter,_std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>_>
           ::top((stack<Catch::JsonArrayWriter,_std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>_>
                  *)0x1a366d);
  return pvVar2;
}

Assistant:

JsonArrayWriter& JsonReporter::startArray( StringRef key ) {
        m_arrayWriters.emplace(
            m_objectWriters.top().write( key ).writeArray() );
        m_writers.emplace( Writer::Array );
        return m_arrayWriters.top();
    }